

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void __thiscall
Am_Priority_List::insert_item_at_right_place(Am_Priority_List *this,Am_Priority_List_Item *item)

{
  float fVar1;
  int my_third_priority;
  int my_second_priority;
  float my_main_priority;
  Am_Priority_List_Item *p;
  Am_Priority_List_Item *item_local;
  Am_Priority_List *this_local;
  
  _my_second_priority = this->head;
  if (_my_second_priority == (Am_Priority_List_Item *)0x0) {
    this->head = item;
    this->tail = item;
    item->next = (Am_Priority_List_Item *)0x0;
    item->prev = (Am_Priority_List_Item *)0x0;
  }
  else {
    fVar1 = item->main_priority;
    for (; _my_second_priority != (Am_Priority_List_Item *)0x0;
        _my_second_priority = _my_second_priority->next) {
      if (_my_second_priority->main_priority < fVar1) {
LAB_002fcb21:
        if (_my_second_priority->prev == (Am_Priority_List_Item *)0x0) {
          this->head = item;
          item->prev = (Am_Priority_List_Item *)0x0;
        }
        else {
          _my_second_priority->prev->next = item;
          item->prev = _my_second_priority->prev;
        }
        item->next = _my_second_priority;
        _my_second_priority->prev = item;
        return;
      }
      if (((_my_second_priority->main_priority == fVar1) &&
          (!NAN(_my_second_priority->main_priority) && !NAN(fVar1))) &&
         ((_my_second_priority->second_priority < item->second_priority ||
          ((_my_second_priority->second_priority == item->second_priority &&
           (_my_second_priority->third_priority <= item->third_priority)))))) goto LAB_002fcb21;
    }
    item->next = (Am_Priority_List_Item *)0x0;
    item->prev = this->tail;
    this->tail->next = item;
    this->tail = item;
  }
  return;
}

Assistant:

void
Am_Priority_List::insert_item_at_right_place(Am_Priority_List_Item *item)
{
  Am_Priority_List_Item *p = head;
  if (!p) { // list is empty
    head = item;
    tail = item;
    item->next = nullptr;
    item->prev = nullptr;
  } else { // search for place
    float my_main_priority = item->main_priority;
    int my_second_priority = item->second_priority;
    int my_third_priority = item->third_priority;
    for (; p != nullptr; p = p->next) {
      if (p->main_priority < my_main_priority ||
          (p->main_priority == my_main_priority &&
           (p->second_priority < my_second_priority ||
            (p->second_priority == my_second_priority &&
             p->third_priority <= my_third_priority)))) {
        // then put item before p
        if (p->prev) {
          p->prev->next = item;
          item->prev = p->prev;
        } else { // p is the first in list
          head = item;
          item->prev = nullptr;
        }
        item->next = p;
        p->prev = item;
        return;
      }
    } // end for
    //if get here, then item should go last in the list
    item->next = nullptr;
    item->prev = tail;
    tail->next = item;
    tail = item;
  }
}